

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

void __thiscall capnp::_::PointerBuilder::setBlob<capnp::Data>(PointerBuilder *this,Reader value)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  BuilderArena *this_00;
  unsigned_long value_00;
  WirePointer *pWVar1;
  uint uVar2;
  WirePointer *__dest;
  AllocateResult AVar3;
  anon_class_1_0_00000001 local_31;
  
  value_00 = value.super_ArrayPtr<const_unsigned_char>.size_;
  ref = this->pointer;
  segment = this->segment;
  capTable = this->capTable;
  assertMaxBits<29u,unsigned_long,capnp::_::WireHelpers::setDataPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::Data::Reader,capnp::_::BuilderArena*)::_lambda()_1_>
            (value_00,(anon_class_1_0_00000001 *)value.super_ArrayPtr<const_unsigned_char>.ptr);
  uVar2 = (int)value.super_ArrayPtr<const_unsigned_char>.size_ + 7U >> 3;
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,capTable,ref);
  }
  __dest = (WirePointer *)segment->pos;
  if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
             ((segment->super_SegmentReader).ptr.size_ * 8 - (long)__dest)) >> 3 <
       (long)(ulong)uVar2) ||
     (segment->pos = (word *)(__dest + uVar2), __dest == (WirePointer *)0x0)) {
    this_00 = (BuilderArena *)(segment->super_SegmentReader).arena;
    uVar2 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                      (uVar2 + 1,&local_31);
    AVar3 = BuilderArena::allocate(this_00,uVar2);
    pWVar1 = (WirePointer *)AVar3.words;
    (ref->offsetAndKind).value =
         (int)AVar3.words - *(int *)&((AVar3.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U |
         2;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                   ((AVar3.segment)->super_SegmentReader).id.value;
    (pWVar1->offsetAndKind).value = 1;
    __dest = pWVar1 + 1;
  }
  else {
    (ref->offsetAndKind).value = ((uint)((ulong)((long)__dest - (long)ref) >> 1) & 0xfffffffc) - 3;
    pWVar1 = ref;
  }
  (pWVar1->field_1).upper32Bits = (int)value.super_ArrayPtr<const_unsigned_char>.size_ * 8 + 2;
  if (value_00 != 0) {
    memcpy(__dest,(anon_class_1_0_00000001 *)value.super_ArrayPtr<const_unsigned_char>.ptr,value_00)
    ;
  }
  return;
}

Assistant:

void PointerBuilder::setBlob<Data>(Data::Reader value) {
  WireHelpers::setDataPointer(pointer, segment, capTable, value);
}